

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::TinyGLTF::~TinyGLTF(TinyGLTF *this)

{
  std::_Function_base::~_Function_base(&(this->WriteImageData).super__Function_base);
  std::_Function_base::~_Function_base(&(this->LoadImageData).super__Function_base);
  URICallbacks::~URICallbacks(&this->uri_cb);
  FsCallbacks::~FsCallbacks(&this->fs);
  std::__cxx11::string::~string((string *)&this->err_);
  std::__cxx11::string::~string((string *)&this->warn_);
  return;
}

Assistant:

~TinyGLTF() = default;